

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

keypress keymap_get_trigger(void)

{
  undefined8 extraout_RDX;
  keypress kVar1;
  undefined1 local_b0;
  ui_event_type local_a0;
  undefined1 auStack_88 [8];
  keypress buf [2];
  char local_68 [8];
  char tmp [80];
  
  auStack_88._0_4_ = EVT_NONE;
  auStack_88._4_4_ = 0;
  buf[0].type = EVT_NONE;
  buf[0].code = 0;
  buf[0].mods = '\0';
  buf[0]._9_3_ = 0;
  buf[1].type = EVT_NONE;
  event_signal(EVENT_INPUT_FLUSH);
  kVar1 = inkey();
  auStack_88 = kVar1._0_8_;
  local_a0 = CONCAT31(local_a0._1_3_,kVar1.mods);
  buf[0].type = local_a0;
  keypress_to_text(local_68,0x50,(keypress *)auStack_88,false);
  Term_addstr(L'\xffffffff',L'\x01',local_68);
  event_signal(EVENT_INPUT_FLUSH);
  local_b0 = (undefined1)buf[0]._0_8_;
  kVar1._8_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_b0);
  kVar1.type = auStack_88._0_4_;
  kVar1.code = auStack_88._4_4_;
  return kVar1;
}

Assistant:

static struct keypress keymap_get_trigger(void)
{
	char tmp[80];
	struct keypress buf[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

	/* Flush */
	event_signal(EVENT_INPUT_FLUSH);

	/* Get a key */
	buf[0] = inkey();

	/* Convert to ascii */
	keypress_to_text(tmp, sizeof(tmp), buf, false);

	/* Hack -- display the trigger */
	Term_addstr(-1, COLOUR_WHITE, tmp);

	/* Flush */
	event_signal(EVENT_INPUT_FLUSH);

	/* Return trigger */
	return buf[0];
}